

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O0

void __thiscall KmerCounter::read_counts(KmerCounter *this,ifstream *count_file)

{
  char *in_RSI;
  string *in_RDI;
  ifstream *unaff_retaddr;
  string *v;
  
  v = in_RDI;
  std::istream::read(in_RSI,(long)(in_RDI + 4));
  std::istream::read(in_RSI,(long)&in_RDI[4].field_2);
  sdglib::read_string(unaff_retaddr,v);
  sdglib::read_stringvector
            ((ifstream *)this,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)count_file);
  if ((char)in_RDI[4]._M_dataplus < ' ') {
    sdglib::read_flat_vector<unsigned_long>
              (unaff_retaddr,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)v);
  }
  else {
    sdglib::read_flat_vector<unsigned__int128>
              (unaff_retaddr,(vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)v);
  }
  sdglib::read_flat_vectorvector<unsigned_short>
            ((ifstream *)this,
             (vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              *)count_file);
  return;
}

Assistant:

void KmerCounter::read_counts(std::ifstream &count_file) {
    count_file.read((char *) &k, sizeof(k));
    count_file.read((char *) &count_mode, sizeof(count_mode));
    sdglib::read_string(count_file,name);
    sdglib::read_stringvector(count_file,count_names);
    if (k<=31) sdglib::read_flat_vector(count_file,kindex);
    else sdglib::read_flat_vector(count_file,kindex128);
    sdglib::read_flat_vectorvector(count_file,counts);
}